

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void lengthFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *local_30;
  uchar *z;
  int len;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iVar2 = sqlite3_value_type(*argv);
  if (1 < iVar2 - 1U) {
    if (iVar2 == 3) {
      local_30 = sqlite3_value_text(*argv);
      if (local_30 == (byte *)0x0) {
        return;
      }
      z._4_4_ = 0;
      while (*local_30 != 0) {
        z._4_4_ = z._4_4_ + 1;
        pbVar3 = local_30 + 1;
        bVar1 = *local_30;
        local_30 = pbVar3;
        if (0xbf < bVar1) {
          for (; (*local_30 & 0xc0) == 0x80; local_30 = local_30 + 1) {
          }
        }
      }
      sqlite3_result_int(context,z._4_4_);
      return;
    }
    if (iVar2 != 4) {
      sqlite3_result_null(context);
      return;
    }
  }
  iVar2 = sqlite3_value_bytes(*argv);
  sqlite3_result_int(context,iVar2);
  return;
}

Assistant:

static void lengthFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int len;

  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_BLOB:
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      sqlite3_result_int(context, sqlite3_value_bytes(argv[0]));
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_value_text(argv[0]);
      if( z==0 ) return;
      len = 0;
      while( *z ){
        len++;
        SQLITE_SKIP_UTF8(z);
      }
      sqlite3_result_int(context, len);
      break;
    }
    default: {
      sqlite3_result_null(context);
      break;
    }
  }
}